

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_CCtx_setCParams(ZSTD_CCtx *cctx,ZSTD_compressionParameters cparams)

{
  size_t sVar1;
  undefined4 in_ECX;
  int iVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(0x7fffffe9 < (int)(cparams.windowLog - 0x20 ^ 0x80000000));
  auVar3._4_4_ = -(uint)(0x7fffffe6 < (int)(cparams.chainLog - 0x1f ^ 0x80000000));
  auVar3._8_4_ = -(uint)(0x7fffffe6 < (int)(cparams.hashLog - 0x1f ^ 0x80000000));
  auVar3._12_4_ = -(uint)(0x7fffffe1 < (int)(cparams.searchLog - 0x1f ^ 0x80000000));
  iVar2 = movmskps(in_ECX,auVar3);
  sVar1 = 0xffffffffffffffd6;
  if (iVar2 == 0xf) {
    if ((cparams.strategy - ZSTD_fast < 9 &&
         (cparams.targetLength < 0x20001 && cparams.minMatch - 3 < 5)) &&
       (sVar1 = 0xffffffffffffffc4, cctx->streamStage == zcss_init)) {
      (cctx->requestedParams).cParams.windowLog = cparams.windowLog;
      (cctx->requestedParams).cParams.chainLog = cparams.chainLog;
      (cctx->requestedParams).cParams.hashLog = cparams.hashLog;
      (cctx->requestedParams).cParams.searchLog = cparams.searchLog;
      (cctx->requestedParams).cParams.minMatch = cparams.minMatch;
      (cctx->requestedParams).cParams.targetLength = cparams.targetLength;
      (cctx->requestedParams).cParams.strategy = cparams.strategy;
      return 0;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx* cctx, ZSTD_compressionParameters cparams)
{
    ZSTD_STATIC_ASSERT(sizeof(cparams) == 7 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setCParams");
    /* only update if all parameters are valid */
    FORWARD_IF_ERROR(ZSTD_checkCParams(cparams), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_windowLog, cparams.windowLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_chainLog, cparams.chainLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_hashLog, cparams.hashLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_searchLog, cparams.searchLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_minMatch, cparams.minMatch), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_targetLength, cparams.targetLength), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_strategy, cparams.strategy), "");
    return 0;
}